

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_add_buffer_Test::TestBody(Buffer_change_event_add_buffer_Test *this)

{
  initializer_list<bfy_changed_cb_info> __l;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  AssertHelper local_250;
  Message local_248;
  allocator<bfy_changed_cb_info> local_239;
  bfy_changed_cb_info local_238;
  iterator local_218;
  size_type local_210;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_208;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_1;
  Message local_1d8;
  int local_1d0 [2];
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar;
  bfy_changed_cb_info expected;
  undefined1 local_190 [8];
  BufferWithReadonlyStrings donor;
  BufferWithReadonlyStrings local;
  Buffer_change_event_add_buffer_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)
             &donor.changes.
              super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_190);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )bfy_buffer_get_content_len
                   ((bfy_buffer *)
                    &donor.changes.
                     super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar2 = bfy_buffer_get_content_len((bfy_buffer *)local_190);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
            ((BufferWithReadonlyStrings *)
             &donor.changes.
              super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_1d0[1] = 0;
  local_1d0[0] = bfy_buffer_add_buffer
                           ((bfy_buffer *)
                            &donor.changes.
                             super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (bfy_buffer *)local_190);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1c8,"0","bfy_buffer_add_buffer(&local.buf, &donor.buf)",local_1d0 + 1
             ,local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x54d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_238.n_deleted = 0;
  local_238.orig_size =
       (size_t)gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  local_218 = &local_238;
  local_210 = 1;
  local_238.n_added = sVar2;
  std::allocator<bfy_changed_cb_info>::allocator(&local_239);
  __l._M_len = local_210;
  __l._M_array = local_218;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            (&local_208,__l,&local_239);
  testing::internal::EqHelper::
  Compare<std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_nullptr>
            ((EqHelper *)local_1f0,"changes_t{expected}","local.changes",&local_208,
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
             ((long)&local.allstrs.field_2 + 8));
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~vector(&local_208);
  std::allocator<bfy_changed_cb_info>::~allocator(&local_239);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x54e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_190);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)
             &donor.changes.
              super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Buffer, change_event_add_buffer) {
    BufferWithReadonlyStrings local;
    BufferWithReadonlyStrings donor;
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = bfy_buffer_get_content_len(&donor.buf),
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    EXPECT_EQ(0, bfy_buffer_add_buffer(&local.buf, &donor.buf));
    EXPECT_EQ(changes_t{expected}, local.changes);
}